

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglxintegration.cpp
# Opt level: O1

Window createDummyWindow(Display *dpy,GLXFBConfig config,int screenNumber,Window rootWin)

{
  long lVar1;
  XVisualInfo *visualInfo;
  Window WVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  visualInfo = (XVisualInfo *)glXGetVisualFromFBConfig();
  if (visualInfo == (XVisualInfo *)0x0) {
    createDummyWindow();
  }
  else {
    WVar2 = createDummyWindow(dpy,visualInfo,screenNumber,rootWin);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      XFree(visualInfo);
      return WVar2;
    }
  }
  __stack_chk_fail();
}

Assistant:

static Window createDummyWindow(Display *dpy, GLXFBConfig config, int screenNumber, Window rootWin)
{
    XVisualInfo *visualInfo = glXGetVisualFromFBConfig(dpy, config);
    if (Q_UNLIKELY(!visualInfo))
        qFatal("Could not initialize GLX");
    Window window = createDummyWindow(dpy, visualInfo, screenNumber, rootWin);
    XFree(visualInfo);
    return window;
}